

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void print_bgparam(int bg,bg_referencepoint_container_t x,bg_referencepoint_container_t y,
                  bg_rotation_scaling_t pa,bg_rotation_scaling_t pb,bg_rotation_scaling_t pc,
                  bg_rotation_scaling_t pd)

{
  bg_rotation_scaling_t bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ushort in_CX;
  ushort uVar10;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined8 in_RSI;
  uint in_EDI;
  ushort in_R8W;
  ushort in_R9W;
  bg_rotation_scaling_t local_50;
  undefined1 local_4c [4];
  undefined1 local_48 [4];
  undefined1 local_44 [4];
  uint local_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  bg_rotation_scaling_t *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_50 = pd;
  bVar1 = local_50;
  local_38 = (uint)in_RSI;
  local_24 = local_38;
  iVar2 = 1;
  if (((byte)((ulong)in_RSI >> 0x18) >> 3 & 1) != 0) {
    iVar2 = -1;
  }
  local_40 = (uint)CONCAT71(in_register_00000011,in_DL);
  local_28 = local_40;
  iVar3 = 1;
  if (((byte)((uint7)in_register_00000011 >> 0x10) >> 3 & 1) != 0) {
    iVar3 = -1;
  }
  uStack_34 = (uint)((ulong)in_RSI >> 0x20);
  local_2c = uStack_34;
  iVar4 = 1;
  if (((byte)((ulong)in_RSI >> 0x3b) & 1) != 0) {
    iVar4 = -1;
  }
  uStack_3c = (uint)((uint7)in_register_00000011 >> 0x18);
  local_30 = uStack_3c;
  iVar5 = 1;
  if (((byte)((uint7)in_register_00000011 >> 0x33) & 1) != 0) {
    iVar5 = -1;
  }
  local_8 = local_44;
  iVar6 = 1;
  if ((short)in_CX < 0) {
    iVar6 = -1;
  }
  local_10 = local_48;
  iVar7 = 1;
  if ((short)in_R8W < 0) {
    iVar7 = -1;
  }
  local_18 = local_4c;
  iVar8 = 1;
  if ((short)in_R9W < 0) {
    iVar8 = -1;
  }
  local_20 = &local_50;
  local_50.raw = pd.sraw;
  iVar9 = 1;
  if (local_50.sraw < 0) {
    iVar9 = -1;
  }
  uVar10 = local_50.raw >> 8;
  local_50 = bVar1;
  DUI_Print((char *)(double)(int)(iVar2 * (local_38 >> 8 & 0x7ffff)),
            (double)(int)(iVar3 * (local_40 >> 8 & 0x7ffff)),
            (double)(int)(iVar4 * (uStack_34 >> 8 & 0x7ffff)),
            (double)(int)(iVar5 * (uStack_3c >> 8 & 0x7ffff)),
            (double)(int)(iVar6 * (uint)(in_CX >> 8 & 0x7f)),
            (double)(int)(iVar7 * (uint)(in_R8W >> 8 & 0x7f)),
            (double)(int)(iVar8 * (uint)(in_R9W >> 8 & 0x7f)),
            (double)(int)(iVar9 * (uint)(uVar10 & 0x7f)),
            "BG%d - Initial X: %f Y: %f Current: X: %f Y: %f | PA: %f PB: %f PC: %f PD: %f",
            (ulong)in_EDI);
  DUI_Newline();
  return;
}

Assistant:

void print_bgparam(int bg, bg_referencepoint_container_t x, bg_referencepoint_container_t y, bg_rotation_scaling_t pa, bg_rotation_scaling_t pb, bg_rotation_scaling_t pc, bg_rotation_scaling_t pd) {
    DUI_Println("BG%d - Initial X: %f Y: %f Current: X: %f Y: %f | PA: %f PB: %f PC: %f PD: %f", bg,
            REF_TO_DOUBLE(x.initial),
            REF_TO_DOUBLE(y.initial),
            REF_TO_DOUBLE(x.current),
            REF_TO_DOUBLE(y.current),
            ROTSCALE_TO_DOUBLE(&pa),
            ROTSCALE_TO_DOUBLE(&pb),
            ROTSCALE_TO_DOUBLE(&pc),
            ROTSCALE_TO_DOUBLE(&pd));
}